

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O1

void __thiscall SymbolData::startFunction(SymbolData *this,int64_t address)

{
  pointer *ppSVar1;
  int iVar2;
  pointer pSVar3;
  iterator __position;
  SymDataFunction func;
  SymDataFunction local_20;
  
  if (this->currentFunction != -1) {
    endFunction(this,address);
  }
  iVar2 = this->currentModule;
  pSVar3 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl
           .super__Vector_impl_data._M_start;
  this->currentFunction =
       (int)((ulong)((long)*(pointer *)
                            ((long)&pSVar3[iVar2].functions.
                                    super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>
                                    ._M_impl + 8) -
                    *(long *)&pSVar3[iVar2].functions.
                              super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
                              _M_impl) >> 4);
  local_20.size = 0;
  __position._M_current =
       *(pointer *)
        ((long)&pSVar3[iVar2].functions.
                super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl + 8);
  if (__position._M_current ==
      *(pointer *)
       ((long)&pSVar3[iVar2].functions.
               super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl + 0x10)
     ) {
    local_20.address = address;
    std::vector<SymDataFunction,std::allocator<SymDataFunction>>::
    _M_realloc_insert<SymDataFunction_const&>
              ((vector<SymDataFunction,std::allocator<SymDataFunction>> *)&pSVar3[iVar2].functions,
               __position,&local_20);
  }
  else {
    (__position._M_current)->address = address;
    (__position._M_current)->size = 0;
    ppSVar1 = (pointer *)
              ((long)&pSVar3[iVar2].functions.
                      super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl
              + 8);
    *ppSVar1 = *ppSVar1 + 1;
  }
  return;
}

Assistant:

void SymbolData::startFunction(int64_t address)
{
	if (currentFunction != -1)
	{
		endFunction(address);
	}

	currentFunction = (int)modules[currentModule].functions.size();

	SymDataFunction func;
	func.address = address;
	func.size = 0;
	modules[currentModule].functions.push_back(func);
}